

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonParseValue(JsonParse *pParse,u32 i)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ushort uVar7;
  int iVar8;
  JsonNode *pJVar9;
  u32 uVar10;
  uint local_48;
  u8 local_41;
  u8 seenE;
  u8 seenDP;
  u8 jnFlags;
  char *z;
  JsonNode *pNode;
  int x;
  int iThis;
  u32 j;
  char c;
  u32 i_local;
  JsonParse *pParse_local;
  
  pcVar3 = pParse->zJson;
  j = i;
  while (""[(byte)pcVar3[j]] != '\0') {
    j = j + 1;
  }
  cVar1 = pcVar3[j];
  if (cVar1 == '{') {
    iVar8 = jsonParseAddNode(pParse,7,0,(char *)0x0);
    if (iVar8 < 0) {
      pParse_local._4_4_ = -1;
    }
    else {
      do {
        do {
          uVar10 = j;
          x = uVar10 + 1;
          j = x;
        } while (""[(byte)pcVar3[(uint)x]] != '\0');
        uVar7 = pParse->iDepth + 1;
        pParse->iDepth = uVar7;
        if (2000 < uVar7) {
          return -1;
        }
        x = jsonParseValue(pParse,x);
        if (x < 0) {
          pParse->iDepth = pParse->iDepth - 1;
          if ((x == -2) && (pParse->nNode == iVar8 + 1U)) {
            return uVar10 + 2;
          }
          return -1;
        }
        if (pParse->oom != '\0') {
          return -1;
        }
        pJVar9 = pParse->aNode + (pParse->nNode - 1);
        if (pJVar9->eType != '\x05') {
          return -1;
        }
        pJVar9->jnFlags = pJVar9->jnFlags | 0x40;
        while (""[(byte)pcVar3[(uint)x]] != '\0') {
          x = x + 1;
        }
        if (pcVar3[(uint)x] != ':') {
          return -1;
        }
        x = jsonParseValue(pParse,x + 1);
        pParse->iDepth = pParse->iDepth - 1;
        if (x < 0) {
          return -1;
        }
        while (""[(byte)pcVar3[(uint)x]] != '\0') {
          x = x + 1;
        }
        j = x;
      } while (pcVar3[(uint)x] == ',');
      if (pcVar3[(uint)x] == '}') {
        pParse->aNode[iVar8].n = (pParse->nNode - iVar8) - 1;
        pParse_local._4_4_ = x + 1;
      }
      else {
        pParse_local._4_4_ = -1;
      }
    }
  }
  else if (cVar1 == '[') {
    iVar8 = jsonParseAddNode(pParse,6,0,(char *)0x0);
    if (iVar8 < 0) {
      pParse_local._4_4_ = -1;
    }
    else {
      memset(&pParse->aNode[iVar8].u,0,8);
      do {
        do {
          uVar10 = j;
          x = uVar10 + 1;
          j = x;
        } while (""[(byte)pcVar3[(uint)x]] != '\0');
        uVar7 = pParse->iDepth + 1;
        pParse->iDepth = uVar7;
        if (2000 < uVar7) {
          return -1;
        }
        x = jsonParseValue(pParse,x);
        pParse->iDepth = pParse->iDepth - 1;
        if (x < 0) {
          if ((x == -3) && (pParse->nNode == iVar8 + 1U)) {
            return uVar10 + 2;
          }
          return -1;
        }
        while (""[(byte)pcVar3[(uint)x]] != '\0') {
          x = x + 1;
        }
        j = x;
      } while (pcVar3[(uint)x] == ',');
      if (pcVar3[(uint)x] == ']') {
        pParse->aNode[iVar8].n = (pParse->nNode - iVar8) - 1;
        pParse_local._4_4_ = x + 1;
      }
      else {
        pParse_local._4_4_ = -1;
      }
    }
  }
  else if (cVar1 == '\"') {
    local_41 = '\0';
    uVar10 = j;
    do {
      while( true ) {
        uVar6 = uVar10;
        x = uVar6 + 1;
        bVar2 = pcVar3[(uint)x];
        if ((bVar2 & 0xe0) == 0) {
          return -1;
        }
        if (bVar2 != 0x5c) break;
        uVar10 = uVar6 + 2;
        cVar1 = pcVar3[uVar10];
        if ((((((cVar1 != '\"') && (cVar1 != '\\')) && (cVar1 != '/')) &&
             ((cVar1 != 'b' && (cVar1 != 'f')))) &&
            ((cVar1 != 'n' && ((cVar1 != 'r' && (cVar1 != 't')))))) &&
           ((cVar1 != 'u' || (iVar8 = jsonIs4Hex(pcVar3 + (ulong)uVar10 + 1), iVar8 == 0)))) {
          return -1;
        }
        local_41 = '\x02';
      }
      uVar10 = x;
    } while (bVar2 != 0x22);
    jsonParseAddNode(pParse,5,(uVar6 + 2) - j,pcVar3 + j);
    if (pParse->oom == '\0') {
      pParse->aNode[pParse->nNode - 1].jnFlags = local_41;
    }
    pParse_local._4_4_ = uVar6 + 2;
  }
  else if (((cVar1 == 'n') && (iVar8 = strncmp(pcVar3 + j,"null",4), iVar8 == 0)) &&
          ((""[(byte)pcVar3[j + 4]] & 6) == 0)) {
    jsonParseAddNode(pParse,0,0,(char *)0x0);
    pParse_local._4_4_ = j + 4;
  }
  else if (((cVar1 == 't') && (iVar8 = strncmp(pcVar3 + j,"true",4), iVar8 == 0)) &&
          ((""[(byte)pcVar3[j + 4]] & 6) == 0)) {
    jsonParseAddNode(pParse,1,0,(char *)0x0);
    pParse_local._4_4_ = j + 4;
  }
  else if (((cVar1 == 'f') && (iVar8 = strncmp(pcVar3 + j,"false",5), iVar8 == 0)) &&
          ((""[(byte)pcVar3[j + 5]] & 6) == 0)) {
    jsonParseAddNode(pParse,2,0,(char *)0x0);
    pParse_local._4_4_ = j + 5;
  }
  else {
    if ((cVar1 == '-') || (('/' < cVar1 && (cVar1 < ':')))) {
      bVar4 = false;
      bVar5 = false;
      uVar10 = j;
      if (cVar1 < '1') {
        if (cVar1 == '-') {
          local_48 = j + 1;
        }
        else {
          local_48 = j;
        }
        if (((pcVar3[local_48] == '0') && ('/' < pcVar3[local_48 + 1])) &&
           (pcVar3[local_48 + 1] < ':')) {
          return -1;
        }
      }
LAB_00273ba0:
      uVar6 = uVar10;
      x = uVar6 + 1;
      cVar1 = pcVar3[(uint)x];
      if ('/' < cVar1) {
        uVar10 = x;
        if (cVar1 < ':') goto LAB_00273ba0;
      }
      if (cVar1 == '.') {
        if (pcVar3[uVar6] == '-') {
          return -1;
        }
        if (bVar4) {
          return -1;
        }
        bVar4 = true;
        uVar10 = x;
      }
      else {
        if ((cVar1 != 'e') && (cVar1 != 'E')) {
          if (pcVar3[uVar6] < '0') {
            return -1;
          }
          uVar10 = 3;
          if (bVar4) {
            uVar10 = 4;
          }
          jsonParseAddNode(pParse,uVar10,x - j,pcVar3 + j);
          return x;
        }
        if (pcVar3[uVar6] < '0') {
          return -1;
        }
        if (bVar5) {
          return -1;
        }
        bVar5 = true;
        bVar4 = true;
        iThis._3_1_ = pcVar3[uVar6 + 2];
        if ((iThis._3_1_ == '+') || (iThis._3_1_ == '-')) {
          x = uVar6 + 2;
          iThis._3_1_ = pcVar3[uVar6 + 3];
        }
        if ((iThis._3_1_ < '0') || (uVar10 = x, '9' < iThis._3_1_)) {
          return -1;
        }
      }
      goto LAB_00273ba0;
    }
    if (cVar1 == '}') {
      pParse_local._4_4_ = -2;
    }
    else if (cVar1 == ']') {
      pParse_local._4_4_ = -3;
    }
    else if (cVar1 == '\0') {
      pParse_local._4_4_ = 0;
    }
    else {
      pParse_local._4_4_ = -1;
    }
  }
  return pParse_local._4_4_;
}

Assistant:

static int jsonParseValue(JsonParse *pParse, u32 i){
  char c;
  u32 j;
  int iThis;
  int x;
  JsonNode *pNode;
  const char *z = pParse->zJson;
  while( fast_isspace(z[i]) ){ i++; }
  if( (c = z[i])=='{' ){
    /* Parse object */
    iThis = jsonParseAddNode(pParse, JSON_OBJECT, 0, 0);
    if( iThis<0 ) return -1;
    for(j=i+1;;j++){
      while( fast_isspace(z[j]) ){ j++; }
      if( ++pParse->iDepth > JSON_MAX_DEPTH ) return -1;
      x = jsonParseValue(pParse, j);
      if( x<0 ){
        pParse->iDepth--;
        if( x==(-2) && pParse->nNode==(u32)iThis+1 ) return j+1;
        return -1;
      }
      if( pParse->oom ) return -1;
      pNode = &pParse->aNode[pParse->nNode-1];
      if( pNode->eType!=JSON_STRING ) return -1;
      pNode->jnFlags |= JNODE_LABEL;
      j = x;
      while( fast_isspace(z[j]) ){ j++; }
      if( z[j]!=':' ) return -1;
      j++;
      x = jsonParseValue(pParse, j);
      pParse->iDepth--;
      if( x<0 ) return -1;
      j = x;
      while( fast_isspace(z[j]) ){ j++; }
      c = z[j];
      if( c==',' ) continue;
      if( c!='}' ) return -1;
      break;
    }
    pParse->aNode[iThis].n = pParse->nNode - (u32)iThis - 1;
    return j+1;
  }else if( c=='[' ){
    /* Parse array */
    iThis = jsonParseAddNode(pParse, JSON_ARRAY, 0, 0);
    if( iThis<0 ) return -1;
    memset(&pParse->aNode[iThis].u, 0, sizeof(pParse->aNode[iThis].u));
    for(j=i+1;;j++){
      while( fast_isspace(z[j]) ){ j++; }
      if( ++pParse->iDepth > JSON_MAX_DEPTH ) return -1;
      x = jsonParseValue(pParse, j);
      pParse->iDepth--;
      if( x<0 ){
        if( x==(-3) && pParse->nNode==(u32)iThis+1 ) return j+1;
        return -1;
      }
      j = x;
      while( fast_isspace(z[j]) ){ j++; }
      c = z[j];
      if( c==',' ) continue;
      if( c!=']' ) return -1;
      break;
    }
    pParse->aNode[iThis].n = pParse->nNode - (u32)iThis - 1;
    return j+1;
  }else if( c=='"' ){
    /* Parse string */
    u8 jnFlags = 0;
    j = i+1;
    for(;;){
      c = z[j];
      if( (c & ~0x1f)==0 ){
        /* Control characters are not allowed in strings */
        return -1;
      }
      if( c=='\\' ){
        c = z[++j];
        if( c=='"' || c=='\\' || c=='/' || c=='b' || c=='f'
           || c=='n' || c=='r' || c=='t'
           || (c=='u' && jsonIs4Hex(z+j+1)) ){
          jnFlags = JNODE_ESCAPE;
        }else{
          return -1;
        }
      }else if( c=='"' ){
        break;
      }
      j++;
    }
    jsonParseAddNode(pParse, JSON_STRING, j+1-i, &z[i]);
    if( !pParse->oom ) pParse->aNode[pParse->nNode-1].jnFlags = jnFlags;
    return j+1;
  }else if( c=='n'
         && strncmp(z+i,"null",4)==0
         && !sqlite3Isalnum(z[i+4]) ){
    jsonParseAddNode(pParse, JSON_NULL, 0, 0);
    return i+4;
  }else if( c=='t'
         && strncmp(z+i,"true",4)==0
         && !sqlite3Isalnum(z[i+4]) ){
    jsonParseAddNode(pParse, JSON_TRUE, 0, 0);
    return i+4;
  }else if( c=='f'
         && strncmp(z+i,"false",5)==0
         && !sqlite3Isalnum(z[i+5]) ){
    jsonParseAddNode(pParse, JSON_FALSE, 0, 0);
    return i+5;
  }else if( c=='-' || (c>='0' && c<='9') ){
    /* Parse number */
    u8 seenDP = 0;
    u8 seenE = 0;
    assert( '-' < '0' );
    if( c<='0' ){
      j = c=='-' ? i+1 : i;
      if( z[j]=='0' && z[j+1]>='0' && z[j+1]<='9' ) return -1;
    }
    j = i+1;
    for(;; j++){
      c = z[j];
      if( c>='0' && c<='9' ) continue;
      if( c=='.' ){
        if( z[j-1]=='-' ) return -1;
        if( seenDP ) return -1;
        seenDP = 1;
        continue;
      }
      if( c=='e' || c=='E' ){
        if( z[j-1]<'0' ) return -1;
        if( seenE ) return -1;
        seenDP = seenE = 1;
        c = z[j+1];
        if( c=='+' || c=='-' ){
          j++;
          c = z[j+1];
        }
        if( c<'0' || c>'9' ) return -1;
        continue;
      }
      break;
    }
    if( z[j-1]<'0' ) return -1;
    jsonParseAddNode(pParse, seenDP ? JSON_REAL : JSON_INT,
                        j - i, &z[i]);
    return j;
  }else if( c=='}' ){
    return -2;  /* End of {...} */
  }else if( c==']' ){
    return -3;  /* End of [...] */
  }else if( c==0 ){
    return 0;   /* End of file */
  }else{
    return -1;  /* Syntax error */
  }
}